

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::MergeBones(aiMesh *out,const_iterator it,const_iterator end)

{
  uint uVar1;
  _List_node_base *p_Var2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  aiBone **ppaVar14;
  aiBone *this;
  Logger *this_00;
  aiVertexWeight *__s;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  aiMatrix4x4 *this_01;
  ulong uVar17;
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> asBones;
  _List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> local_450;
  undefined1 local_430 [1024];
  
  if ((out != (aiMesh *)0x0) && (out->mNumBones != 0)) {
    local_450._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_450;
    local_450._M_impl._M_node._M_size = 0;
    local_450._M_impl._M_node.super__List_node_base._M_prev =
         local_450._M_impl._M_node.super__List_node_base._M_next;
    BuildUniqueBoneList((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                        local_450._M_impl._M_node.super__List_node_base._M_next,it,end);
    out->mNumBones = 0;
    ppaVar14 = (aiBone **)
               operator_new__(-(ulong)(local_450._M_impl._M_node._M_size >> 0x3d != 0) |
                              local_450._M_impl._M_node._M_size << 3);
    out->mBones = ppaVar14;
    p_Var16 = (_List_node_base *)&local_450;
    while (p_Var16 = (((_List_impl *)&p_Var16->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var16 != (_List_node_base *)&local_450) {
      this = (aiBone *)operator_new(0x450);
      aiBone::aiBone(this);
      uVar1 = out->mNumBones;
      out->mNumBones = uVar1 + 1;
      out->mBones[uVar1] = this;
      uVar1 = *(uint *)&(p_Var16[1]._M_prev)->_M_next;
      if (0x3fe < uVar1) {
        uVar1 = 0x3ff;
      }
      uVar17 = (ulong)uVar1;
      memcpy(local_430,(void *)((long)&(p_Var16[1]._M_prev)->_M_next + 4),uVar17);
      local_430[uVar17] = 0;
      (this->mName).length = uVar1;
      memcpy((this->mName).data,local_430,uVar17);
      (this->mName).data[uVar17] = '\0';
      p_Var2 = p_Var16[2]._M_prev;
      this_01 = &this->mOffsetMatrix;
      for (p_Var15 = p_Var16[2]._M_next; p_Var15 != p_Var2; p_Var15 = p_Var15 + 1) {
        this->mNumWeights = this->mNumWeights + *(int *)((long)p_Var15->_M_next + 0x404);
        if (p_Var15 == p_Var16[2]._M_next) {
LAB_003a0e6e:
          lVar3 = (long)p_Var15->_M_next;
          uVar5 = *(undefined8 *)(lVar3 + 0x410);
          uVar6 = *(undefined8 *)(lVar3 + 0x418);
          uVar7 = *(undefined8 *)(lVar3 + 0x420);
          uVar8 = *(undefined8 *)(lVar3 + 0x428);
          uVar9 = *(undefined8 *)(lVar3 + 0x430);
          uVar10 = *(undefined8 *)(lVar3 + 0x438);
          uVar11 = *(undefined8 *)(lVar3 + 0x440);
          uVar12 = *(undefined8 *)(lVar3 + 0x448);
          (this->mOffsetMatrix).d1 = (float)(int)uVar11;
          (this->mOffsetMatrix).d2 = (float)(int)((ulong)uVar11 >> 0x20);
          (this->mOffsetMatrix).d3 = (float)(int)uVar12;
          (this->mOffsetMatrix).d4 = (float)(int)((ulong)uVar12 >> 0x20);
          (this->mOffsetMatrix).c1 = (float)(int)uVar9;
          (this->mOffsetMatrix).c2 = (float)(int)((ulong)uVar9 >> 0x20);
          (this->mOffsetMatrix).c3 = (float)(int)uVar10;
          (this->mOffsetMatrix).c4 = (float)(int)((ulong)uVar10 >> 0x20);
          (this->mOffsetMatrix).b1 = (float)(int)uVar7;
          (this->mOffsetMatrix).b2 = (float)(int)((ulong)uVar7 >> 0x20);
          (this->mOffsetMatrix).b3 = (float)(int)uVar8;
          (this->mOffsetMatrix).b4 = (float)(int)((ulong)uVar8 >> 0x20);
          this_01->a1 = (float)(int)uVar5;
          this_01->a2 = (float)(int)((ulong)uVar5 >> 0x20);
          (this->mOffsetMatrix).a3 = (float)(int)uVar6;
          (this->mOffsetMatrix).a4 = (float)(int)((ulong)uVar6 >> 0x20);
        }
        else {
          bVar13 = aiMatrix4x4t<float>::operator!=
                             (this_01,(aiMatrix4x4t<float> *)((long)p_Var15->_M_next + 0x410));
          if (!bVar13) goto LAB_003a0e6e;
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,
                       "Bones with equal names but different offset matrices can\'t be joined at the moment"
                      );
        }
      }
      uVar1 = this->mNumWeights;
      uVar17 = (ulong)uVar1 * 8;
      __s = (aiVertexWeight *)operator_new__(uVar17);
      if (uVar1 != 0) {
        memset(__s,0,uVar17);
      }
      this->mWeights = __s;
      for (p_Var15 = p_Var16[2]._M_next; (p_Var15 != p_Var2 && (p_Var15 != p_Var16[2]._M_prev));
          p_Var15 = p_Var15 + 1) {
        lVar3 = (long)p_Var15->_M_next;
        for (uVar17 = 0; uVar17 < *(uint *)(lVar3 + 0x404); uVar17 = uVar17 + 1) {
          lVar4 = *(long *)(lVar3 + 0x408);
          __s->mWeight = *(float *)(lVar4 + 4 + uVar17 * 8);
          __s->mVertexId = *(int *)&p_Var15->_M_prev + *(int *)(lVar4 + uVar17 * 8);
          __s = __s + 1;
        }
      }
    }
    std::__cxx11::_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::_M_clear
              (&local_450);
  }
  return;
}

Assistant:

void SceneCombiner::MergeBones(aiMesh* out,std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == out || out->mNumBones == 0 ) {
        return;
    }

    // find we need to build an unique list of all bones.
    // we work with hashes to make the comparisons MUCH faster,
    // at least if we have many bones.
    std::list<BoneWithHash> asBones;
    BuildUniqueBoneList( asBones, it, end );

    // now create the output bones
    out->mNumBones = 0;
    out->mBones = new aiBone*[asBones.size()];

    for (std::list<BoneWithHash>::const_iterator boneIt = asBones.begin(),boneEnd = asBones.end(); boneIt != boneEnd; ++boneIt )  {
        // Allocate a bone and setup it's name
        aiBone* pc = out->mBones[out->mNumBones++] = new aiBone();
        pc->mName = aiString( *( boneIt->second ));

        std::vector< BoneSrcIndex >::const_iterator wend = boneIt->pSrcBones.end();

        // Loop through all bones to be joined for this bone
        for (std::vector< BoneSrcIndex >::const_iterator wmit = boneIt->pSrcBones.begin(); wmit != wend; ++wmit)  {
            pc->mNumWeights += (*wmit).first->mNumWeights;

            // NOTE: different offset matrices for bones with equal names
            // are - at the moment - not handled correctly.
            if (wmit != boneIt->pSrcBones.begin() && pc->mOffsetMatrix != wmit->first->mOffsetMatrix) {
                ASSIMP_LOG_WARN("Bones with equal names but different offset matrices can't be joined at the moment");
                continue;
            }
            pc->mOffsetMatrix = wmit->first->mOffsetMatrix;
        }

        // Allocate the vertex weight array
        aiVertexWeight* avw = pc->mWeights = new aiVertexWeight[pc->mNumWeights];

        // And copy the final weights - adjust the vertex IDs by the
        // face index offset of the corresponding mesh.
        for (std::vector< BoneSrcIndex >::const_iterator wmit = (*boneIt).pSrcBones.begin(); wmit != (*boneIt).pSrcBones.end(); ++wmit) {
            if (wmit == wend) {
                break;
            }

            aiBone* pip = (*wmit).first;
            for (unsigned int mp = 0; mp < pip->mNumWeights;++mp,++avw) {
                const aiVertexWeight& vfi = pip->mWeights[mp];
                avw->mWeight = vfi.mWeight;
                avw->mVertexId = vfi.mVertexId + (*wmit).second;
            }
        }
    }
}